

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PPrintCDATA(TidyDocImpl *doc,uint indent,Node *node)

{
  uint uVar1;
  
  if (*(int *)((doc->config).value + 0x24) == 0) {
    indent = 0;
  }
  PCondFlushLineSmart(doc,indent);
  uVar1 = *(uint *)((doc->config).value + 0x5c);
  prvTidySetOptionInt(doc,TidyWrapLen,0xffffffff);
  AddString(&doc->pprint,"<![CDATA[");
  PPrintText(doc,2,indent,node);
  AddString(&doc->pprint,"]]>");
  PCondFlushLineSmart(doc,indent);
  prvTidySetOptionInt(doc,TidyWrapLen,(ulong)uVar1);
  return;
}

Assistant:

static void PPrintCDATA( TidyDocImpl* doc, uint indent, Node *node )
{
    uint saveWrap;
    TidyPrintImpl* pprint = &doc->pprint;
    Bool indentCData = cfgBool( doc, TidyIndentCdata );
    if ( !indentCData )
        indent = 0;

    PCondFlushLineSmart( doc, indent );
    saveWrap = WrapOff( doc );        /* disable wrapping */

    AddString( pprint, "<![CDATA[" );
    PPrintText( doc, COMMENT, indent, node );
    AddString( pprint, "]]>" );

    PCondFlushLineSmart( doc, indent );
    WrapOn( doc, saveWrap );          /* restore wrapping */
}